

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/ut.cpp:38:21)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_ut_cpp:38:21)>
          *this,string *arg)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_120;
  long *local_100 [2];
  long local_f0 [2];
  ParserResult local_e0;
  SessionSettings local_b0;
  
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  convertInto(&local_e0,arg,&local_120);
  if (local_e0.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type == Ok) {
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
    FIX::SessionSettings::SessionSettings(&local_b0,(string *)local_100,false);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::clear((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
             *)FIX::TestSettings::sessionSettings);
    if (local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
       ) {
      p_Var1 = &local_b0.m_settings._M_t._M_impl.super__Rb_tree_header;
      FIX::TestSettings::sessionSettings._8_4_ =
           local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      FIX::TestSettings::sessionSettings._16_8_ =
           local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      FIX::TestSettings::sessionSettings._24_8_ =
           local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      FIX::TestSettings::sessionSettings._32_8_ =
           local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           (_Base_ptr)(FIX::TestSettings::sessionSettings + 8);
      FIX::TestSettings::sessionSettings._40_8_ =
           local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_b0.m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
      ;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(FIX::TestSettings::sessionSettings + 0x38),&local_b0.m_defaults.m_data._M_t);
    std::__cxx11::string::_M_assign((string *)(FIX::TestSettings::sessionSettings + 0x68));
    FIX::TestSettings::sessionSettings[0x88] = local_b0.m_resolveEnvVars;
    FIX::Dictionary::~Dictionary(&local_b0.m_defaults);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)&local_b0);
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_00323948;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = local_e0.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_00323948;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_errorMessage,
               local_e0.m_errorMessage._M_dataplus._M_p,
               local_e0.m_errorMessage._M_dataplus._M_p + local_e0.m_errorMessage._M_string_length);
  }
  local_e0.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_00323948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.m_errorMessage._M_dataplus._M_p != &local_e0.m_errorMessage.field_2) {
    operator_delete(local_e0.m_errorMessage._M_dataplus._M_p,
                    local_e0.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  local_e0.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__ResultValueBase_003239a0;
  ResultBase::~ResultBase((ResultBase *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }